

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  TokenType TVar1;
  size_type sVar2;
  reference this_00;
  Token local_68;
  size_t local_18;
  size_t n_local;
  WastParser *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  while( true ) {
    sVar2 = CircularArray<wabt::Token,_2UL>::size(&this->tokens_);
    if (local_18 < sVar2) break;
    WastLexer::GetToken(&local_68,this->lexer_,this);
    CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_68);
    Token::~Token(&local_68);
  }
  this_00 = CircularArray<wabt::Token,_2UL>::at(&this->tokens_,local_18);
  TVar1 = Token::token_type(this_00);
  return TVar1;
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n)
    tokens_.push_back(lexer_->GetToken(this));
  return tokens_.at(n).token_type();
}